

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Volume.cpp
# Opt level: O2

void __thiscall imrt::Volume::set_data(Volume *this,string *file)

{
  Collimator *this_00;
  bool bVar1;
  double dVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  istream *piVar6;
  _List_node_base *p_Var7;
  mapped_type *pmVar8;
  runtime_error *this_01;
  int iVar9;
  int i;
  long lVar10;
  _List_node_base *p_Var11;
  int angle;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lines;
  Matrix local_410;
  string line;
  string linec;
  stringstream ss;
  string local_3a8 [368];
  ifstream myfile;
  
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  linec._M_dataplus._M_p = (pointer)&linec.field_2;
  linec._M_string_length = 0;
  linec.field_2._M_local_buf[0] = '\0';
  std::ifstream::ifstream(&myfile,(string *)file,_S_in);
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  this->nb_voxels = -1;
  cVar3 = std::__basic_file<char>::is_open();
  if (cVar3 != '\0') {
    lines.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    lines.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    lines.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&myfile,(string *)&line);
    while( true ) {
      piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&myfile,(string *)&line);
      if (((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) != 0) break;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&lines,&line);
    }
    std::ifstream::close();
    this->nb_voxels =
         (int)((ulong)((long)lines.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)lines.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 5) + -1;
    std::__cxx11::stringbuf::str(local_3a8);
    p_Var7 = (_List_node_base *)Collimator::getAngles_abi_cxx11_(this->collimator);
    p_Var11 = p_Var7;
    while (p_Var11 = (((_List_base<int,_std::allocator<int>_> *)&p_Var11->_M_next)->_M_impl)._M_node
                     .super__List_node_base._M_next, p_Var11 != p_Var7) {
      angle = *(int *)&p_Var11[1]._M_next;
      iVar9 = this->nb_voxels;
      iVar4 = Collimator::getNangleBeamlets(this->collimator,angle);
      maths::Matrix::Matrix(&local_410,iVar9,iVar4);
      pmVar8 = std::
               map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
               ::operator[](&this->D,&angle);
      maths::Matrix::operator=(pmVar8,&local_410);
      maths::Matrix::~Matrix(&local_410);
    }
    for (lVar10 = 0; lVar10 < this->nb_voxels; lVar10 = lVar10 + 1) {
      std::ios::clear((int)*(undefined8 *)(_ss + -0x18) + (int)&ss);
      std::__cxx11::stringbuf::str(local_3a8);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&ss,(string *)&line,'\t');
      iVar4 = 0;
      iVar9 = 0;
      while( true ) {
        piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)&ss,(string *)&line,'\t');
        if (((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) != 0) break;
        this_00 = this->collimator;
        iVar5 = Collimator::getAngle(this_00,iVar4);
        iVar5 = Collimator::getNangleBeamlets(this_00,iVar5);
        bVar1 = iVar5 <= iVar9;
        if (iVar5 <= iVar9) {
          iVar9 = 0;
        }
        iVar4 = iVar4 + (uint)bVar1;
        dVar2 = atof(line._M_dataplus._M_p);
        local_410.rows_ = Collimator::getAngle(this->collimator,iVar4);
        pmVar8 = std::
                 map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
                 ::operator[](&this->D,&local_410.rows_);
        pmVar8->p[lVar10][iVar9] = dVar2;
        iVar9 = iVar9 + 1;
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&lines);
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
    std::ifstream::~ifstream(&myfile);
    std::__cxx11::string::~string((string *)&linec);
    std::__cxx11::string::~string((string *)&line);
    return;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_01,"error reading file.");
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Volume::set_data(string file) {
  string line, linec;
  ifstream myfile (file);
  stringstream ss;
  double aux1, aux2;
  vector <pair<double,double> >::iterator it;

  //nb_beamlets=-1;
  nb_voxels=-1;

  if (!myfile.is_open())
    throw runtime_error("error reading file.");

  // Get dimensions of the matrix voxels/beamlets matrix
  vector<string> lines;
  // First line not considered
  // TODO: read name of the volume!
  getline (myfile,line);
  // Initial reading
  while (getline (myfile,line) )
    lines.push_back(line);
  myfile.close();
  nb_voxels = lines.size()-1;
  ss.str(lines[0]);

  for(auto angle:collimator.getAngles())
    D[angle]=Matrix(nb_voxels, collimator.getNangleBeamlets(angle));

  for (int i=0; i<nb_voxels; i++) {
    ss.clear(); ss.str(lines[i]);
    getline(ss, line, '\t');
    int a=0, j=0;
    int count=0;
    while (getline(ss, line, '\t') ) {
      if (j >= collimator.getNangleBeamlets( collimator.getAngle(a) )) {
        a++; j=0;
      }
      D[ collimator.getAngle(a) ](i,j)=atof(line.c_str());
      j++;
    }
  }

}